

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O1

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::output_diagram(Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
                 *this,ostream *ostream)

{
  __normal_iterator<std::tuple<unsigned_long,_unsigned_long,_int>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>_>
  __first;
  __normal_iterator<std::tuple<unsigned_long,_unsigned_long,_int>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>_>
  __last;
  _Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cmp_intervals_by_length>
  __comp;
  pointer ptVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  long lVar4;
  ostream *poVar5;
  logic_error *this_00;
  ulong uVar6;
  pointer ptVar7;
  double dVar8;
  
  __first._M_current =
       (this->persistent_pairs_).
       super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->persistent_pairs_).
       super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    __comp._M_comp.sc_ = (cmp_intervals_by_length)this->cpx_;
    uVar6 = ((long)__last._M_current - (long)__first._M_current >> 3) * -0x5555555555555555;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,int>*,std::vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>>,Gudhi::persistent_cohomology::Field_Zp>::cmp_intervals_by_length>>
              (__first,__last,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,__comp);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,int>*,std::vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>>,Gudhi::persistent_cohomology::Field_Zp>::cmp_intervals_by_length>>
              (__first,__last,__comp);
  }
  ptVar7 = (this->persistent_pairs_).
           super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (this->persistent_pairs_).
           super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ptVar7 == ptVar1) {
      return;
    }
    uVar2 = (ptVar7->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
            super__Tuple_impl<1UL,_unsigned_long,_int>.super__Head_base<1UL,_unsigned_long,_false>.
            _M_head_impl;
    uVar3 = (ptVar7->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
            super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)ostream,
                        (ptVar7->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
                        super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
    if (uVar3 == 0xffffffffffffffff) break;
    for (uVar6 = (long)(this->cpx_->super_Bitmap_cubical_complex_base<double>).multipliers.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->cpx_->super_Bitmap_cubical_complex_base<double>).multipliers.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2; 1 < uVar6; uVar6 = uVar6 - 1) {
    }
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = std::ostream::_M_insert<double>
                       ((this->cpx_->super_Bitmap_cubical_complex_base<double>).data.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    dVar8 = INFINITY;
    if (uVar2 != 0xffffffffffffffff) {
      dVar8 = (this->cpx_->super_Bitmap_cubical_complex_base<double>).data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar2];
    }
    poVar5 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    ptVar7 = ptVar7 + 1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Only real cells have a dimension");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void output_diagram(std::ostream& ostream = std::cout) {
    cmp_intervals_by_length cmp(cpx_);
    std::sort(std::begin(persistent_pairs_), std::end(persistent_pairs_), cmp);
    for (auto pair : persistent_pairs_) {
      ostream << get<2>(pair) << "  " << cpx_->dimension(get<0>(pair)) << " "
        << cpx_->filtration(get<0>(pair)) << " "
        << cpx_->filtration(get<1>(pair)) << " " << std::endl;
    }
  }